

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bool_arg_max.cpp
# Opt level: O2

void bool_arg_max(vec<BoolView> *x,int offset,IntVar *y)

{
  BoolArgMax *this;
  uint i;
  ulong uVar1;
  long lVar2;
  IntView<0> _y;
  vec<BoolView> w;
  vec<BoolView> local_50;
  BoolView local_40;
  
  w.sz = 0;
  w.cap = 0;
  w.data = (BoolView *)0x0;
  lVar2 = 8;
  for (uVar1 = 0; uVar1 < x->sz; uVar1 = uVar1 + 1) {
    local_40.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_001efbb8;
    local_40.s = *(bool *)((long)&(x->data->super_Var).super_Branching._vptr_Branching + lVar2 + 4);
    local_40.v = *(int *)((long)&(x->data->super_Var).super_Branching._vptr_Branching + lVar2);
    vec<BoolView>::push(&w,&local_40);
    lVar2 = lVar2 + 0x10;
  }
  this = (BoolArgMax *)operator_new(0x38);
  vec<BoolView>::vec<BoolView>(&local_50,&w);
  _y.a = 1;
  _y.b = 0;
  _y.var = y;
  BoolArgMax::BoolArgMax(this,&local_50,offset,_y);
  vec<BoolView>::~vec(&local_50);
  vec<BoolView>::~vec(&w);
  return;
}

Assistant:

void bool_arg_max(vec<BoolView>& x, int offset, IntVar* y) {
	vec<BoolView> w;
	for (unsigned int i = 0; i < x.size(); i++) {
		w.push(BoolView(x[i]));
	}
	new BoolArgMax(w, offset, IntView<>(y));
}